

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::torrent::torrent
          (torrent *this,session_interface *ses,bool session_paused,add_torrent_params *p)

{
  shared_ptr<libtorrent::torrent_info> *this_00;
  undefined1 *puVar1;
  list<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_> *this_01;
  _Rb_tree_header *p_Var2;
  tracker_list *this_02;
  byte bVar3;
  time_t tVar4;
  web_seed_entry *pwVar5;
  pointer pbVar6;
  torrent_info *ptVar7;
  pointer pfVar8;
  pointer pfVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  void *pvVar17;
  vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
  *pvVar18;
  vector<long,_std::allocator<long>_> *pvVar19;
  vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
  *pvVar20;
  vector<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_> *pvVar21;
  vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
  *pvVar22;
  vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_> *pvVar23;
  int64_t iVar24;
  pointer pwVar25;
  node_ptr plVar26;
  int iVar27;
  time_point32 tVar28;
  uint uVar29;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar30;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  __normal_iterator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
  _Var31;
  system_error *this_03;
  byte bVar32;
  byte bVar33;
  char *pcVar34;
  byte bVar35;
  undefined7 in_register_00000011;
  web_seed_entry *e;
  web_seed_entry *__args;
  pointer __args_00;
  pointer piVar36;
  element_type *peVar37;
  pointer pbVar38;
  _Head_base<0UL,_unsigned_int_*,_false> _Var39;
  bool bVar40;
  string_view u;
  error_code ec;
  const_iterator cVar41;
  const_iterator cVar42;
  string_view f;
  vector<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_> ws;
  announce_entry e_1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  _Alloc_hider local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  pointer local_78;
  vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_> local_68;
  vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
  local_48;
  
  pcVar34 = (char *)(CONCAT71(in_register_00000011,session_paused) & 0xffffffff);
  torrent_hot_members::torrent_hot_members(&this->super_torrent_hot_members,ses,p,SUB81(pcVar34,0));
  (this->super_peer_class_set).m_size = '\0';
  (this->super_enable_shared_from_this<libtorrent::aux::torrent>)._M_weak_this.
  super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> =
       (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>)0x0;
  (this->super_request_callback)._vptr_request_callback = (_func_int **)&PTR__torrent_004d03c8;
  this->m_dht_start_time = (duration)0x0;
  (this->m_ip_filter).super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->m_ip_filter).super___shared_ptr<const_libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  uVar10 = *(undefined4 *)((long)&p->total_uploaded + 4);
  iVar24 = p->total_downloaded;
  uVar11 = *(undefined4 *)((long)&p->total_downloaded + 4);
  *(int *)&this->m_total_uploaded = (int)p->total_uploaded;
  *(undefined4 *)((long)&this->m_total_uploaded + 4) = uVar10;
  *(int *)&this->m_total_downloaded = (int)iVar24;
  *(undefined4 *)((long)&this->m_total_downloaded + 4) = uVar11;
  (this->m_ssl_ctx)._M_t.
  super___uniq_ptr_impl<boost::asio::ssl::context,_std::default_delete<boost::asio::ssl::context>_>.
  _M_t.
  super__Tuple_impl<0UL,_boost::asio::ssl::context_*,_std::default_delete<boost::asio::ssl::context>_>
  .super__Head_base<0UL,_boost::asio::ssl::context_*,_false>._M_head_impl = (context *)0x0;
  this_01 = &this->m_web_seeds;
  this->m_padding_bytes = 0;
  (this->m_storage).m_disk_io = (disk_interface *)0x0;
  (this->m_storage).m_idx.m_val = 0;
  (this->m_web_seeds).
  super__List_base<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this_01;
  (this->m_web_seeds).
  super__List_base<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this_01;
  (this->m_web_seeds).
  super__List_base<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>.
  _M_impl._M_node._M_size = 0;
  (this->m_extensions).
  super__List_base<std::shared_ptr<libtorrent::torrent_plugin>,_std::allocator<std::shared_ptr<libtorrent::torrent_plugin>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->m_extensions;
  (this->m_extensions).
  super__List_base<std::shared_ptr<libtorrent::torrent_plugin>,_std::allocator<std::shared_ptr<libtorrent::torrent_plugin>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->m_extensions;
  (this->m_extensions).
  super__List_base<std::shared_ptr<libtorrent::torrent_plugin>,_std::allocator<std::shared_ptr<libtorrent::torrent_plugin>_>_>
  ._M_impl._M_node._M_size = 0;
  iVar27 = (*(ses->super_session_logger)._vptr_session_logger[7])(ses);
  boost::asio::detail::
  io_object_impl<boost::asio::detail::deadline_timer_service<boost::asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>_>_>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::io_object_impl<boost::asio::io_context>
            (&(this->m_tracker_timer).impl_,(io_context *)CONCAT44(extraout_var,iVar27),(type *)0x0)
  ;
  iVar27 = (*(ses->super_session_logger)._vptr_session_logger[7])(ses);
  boost::asio::detail::
  io_object_impl<boost::asio::detail::deadline_timer_service<boost::asio::detail::chrono_time_traits<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>_>_>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::io_object_impl<boost::asio::io_context>
            (&(this->m_inactivity_timer).impl_,(io_context *)CONCAT44(extraout_var_00,iVar27),
             (type *)0x0);
  (this->m_deferred_file_priorities)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_deferred_file_priorities)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  p_Var2 = &(this->m_deferred_file_priorities)._M_t._M_impl.super__Rb_tree_header;
  *(undefined1 (*) [16])&(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL> =
       (undefined1  [16])0x0;
  *(undefined1 (*) [16])
   &(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0x10 =
       (undefined1  [16])0x0;
  *(undefined1 (*) [16])
   &(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0x20 =
       (undefined1  [16])0x0;
  *(undefined1 (*) [16])
   &(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0x30 =
       (undefined1  [16])0x0;
  *(undefined1 (*) [16])
   &(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0x40 =
       (undefined1  [16])0x0;
  *(undefined1 (*) [16])
   &(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0x50 =
       (undefined1  [16])0x0;
  pvVar18 = &(this->m_file_priority).
             super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
  ;
  (pvVar18->
  super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar18->
  super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_file_priority).
  super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
  .
  super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_deferred_file_priorities)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (this->m_deferred_file_priorities)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  this_02 = &this->m_trackers;
  *(undefined1 (*) [16])
   &(this->m_deferred_file_priorities)._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (undefined1  [16])0x0;
  pvVar19 = &(this->m_file_progress).m_file_progress.super_vector<long,_std::allocator<long>_>;
  (pvVar19->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (pvVar19->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->m_file_progress).m_file_progress.super_vector<long,_std::allocator<long>_>.
    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (undefined1  [16])0x0;
  pvVar20 = &(this->m_suggest_pieces).m_priority_pieces.
             super_vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
  ;
  (pvVar20->
  super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar20->
  super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 (*) [16])
   ((long)&(this->m_suggest_pieces).m_priority_pieces.
           super_vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
           .
           super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = (undefined1  [16])0x0;
  tracker_list::tracker_list(this_02);
  (this->m_time_critical_pieces).
  super__Vector_base<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_time_critical_pieces).
  super__Vector_base<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_time_critical_pieces).
  super__Vector_base<libtorrent::aux::time_critical_piece,_std::allocator<libtorrent::aux::time_critical_piece>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ::std::__cxx11::string::string((string *)&this->m_trackerid,(string *)&p->trackerid);
  f._M_str = pcVar34;
  f._M_len = (size_t)(p->save_path)._M_dataplus._M_p;
  complete_abi_cxx11_(&this->m_save_path,(libtorrent *)(p->save_path)._M_string_length,f);
  pvVar21 = &(this->m_merkle_trees).
             super_vector<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>
  ;
  (pvVar21->
  super__Vector_base<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar21->
  super__Vector_base<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->m_predictive_pieces).
    super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  (this->m_predictive_pieces).
  super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_predictive_pieces).
  super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar27 = (*(ses->super_session_logger)._vptr_session_logger[0x4b])();
  this->m_stats_counters = (counters *)CONCAT44(extraout_var_01,iVar27);
  this->m_verified = (bitfield)0x0;
  this->m_verifying = (bitfield)0x0;
  *(undefined8 *)
   ((long)&(this->m_verifying).super_bitfield.m_buf.
           super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
           super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl + 5) = 0;
  (this->m_error).cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  this->m_add_torrent_params =
       (__uniq_ptr_data<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>,_true,_true>
        )0x0;
  this->m_name = (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )0x0;
  lVar30 = p->added_time;
  if (lVar30 == 0) {
    lVar30 = time((time_t *)0x0);
  }
  this->m_added_time = lVar30;
  this->m_completed_time = p->completed_time;
  tVar4 = p->last_seen_complete;
  this->m_last_seen_complete = tVar4;
  this->m_swarm_last_seen_complete = tVar4;
  uVar12 = *(undefined8 *)((p->info_hashes).v1.m_number._M_elems + 2);
  uVar13 = *(undefined8 *)((p->info_hashes).v1.m_number._M_elems + 4);
  uVar14 = *(undefined8 *)((p->info_hashes).v2.m_number._M_elems + 1);
  uVar15 = *(undefined8 *)((p->info_hashes).v2.m_number._M_elems + 3);
  uVar16 = *(undefined8 *)((p->info_hashes).v2.m_number._M_elems + 5);
  *(undefined8 *)(this->m_info_hash).v1.m_number._M_elems =
       *(undefined8 *)(p->info_hashes).v1.m_number._M_elems;
  *(undefined8 *)((this->m_info_hash).v1.m_number._M_elems + 2) = uVar12;
  *(undefined8 *)((this->m_info_hash).v1.m_number._M_elems + 4) = uVar13;
  *(undefined8 *)((this->m_info_hash).v2.m_number._M_elems + 1) = uVar14;
  *(undefined8 *)((this->m_info_hash).v2.m_number._M_elems + 3) = uVar15;
  *(undefined8 *)((this->m_info_hash).v2.m_number._M_elems + 5) = uVar16;
  (this->m_info_hash).v2.m_number._M_elems[7] = (p->info_hashes).v2.m_number._M_elems[7];
  *(undefined4 *)&(this->m_links).super_array<libtorrent::aux::link,_8UL> = 0xffffffff;
  *(undefined4 *)&(this->m_links).super_array<libtorrent::aux::link,_8UL>.field_0x4 = 0xffffffff;
  *(undefined4 *)&(this->m_links).super_array<libtorrent::aux::link,_8UL>.field_0x8 = 0xffffffff;
  *(undefined4 *)&(this->m_links).super_array<libtorrent::aux::link,_8UL>.field_0xc = 0xffffffff;
  *(undefined4 *)&(this->m_links).super_array<libtorrent::aux::link,_8UL>.field_0x10 = 0xffffffff;
  *(undefined4 *)&(this->m_links).super_array<libtorrent::aux::link,_8UL>.field_0x14 = 0xffffffff;
  *(undefined4 *)&(this->m_links).super_array<libtorrent::aux::link,_8UL>.field_0x18 = 0xffffffff;
  *(undefined4 *)&(this->m_links).super_array<libtorrent::aux::link,_8UL>.field_0x1c = 0xffffffff;
  this->m_num_verified = 0;
  tVar28 = time_now32();
  (this->m_started).__d.__r = (rep_conflict)tVar28.__d.__r;
  tVar28 = time_now32();
  (this->m_became_seed).__d.__r = (rep_conflict)tVar28.__d.__r;
  tVar28 = time_now32();
  (this->m_became_finished).__d.__r = (rep_conflict)tVar28.__d.__r;
  this->m_checking_piece = 0;
  this->m_num_checked_pieces = 0;
  (this->m_error_file).m_val = -1;
  this->m_total_redundant_bytes = 0;
  this->m_average_piece_time = 0;
  this->m_piece_time_deviation = 0;
  this->m_total_failed_bytes = 0;
  (this->m_sequence_number).m_val = -1;
  (this->m_outgoing_pids)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_outgoing_pids)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var2 = &(this->m_outgoing_pids)._M_t._M_impl.super__Rb_tree_header;
  (this->m_peers_to_disconnect).
  super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_peers_to_disconnect).
  super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   ((long)&(this->m_peers_to_disconnect).
           super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = (undefined1  [16])0x0;
  (this->m_outgoing_pids)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->m_outgoing_pids)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header
  ;
  (this->m_outgoing_pids)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_peer_class).m_val = 0;
  this->m_num_connecting = 0;
  iVar27 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
             [0x2e])();
  generate_peer_id(&this->m_peer_id,(session_settings *)CONCAT44(extraout_var_02,iVar27));
  tVar28 = time_now32();
  (this->m_upload_mode_time).__d.__r = (rep_conflict)tVar28.__d.__r;
  bVar40 = ((p->flags).m_val & 0x10) == 0;
  bVar35 = this->field_0x5c0;
  bVar3 = this->field_0x5cc;
  this->field_0x5c0 = bVar35 & 0xfe | bVar40;
  bVar35 = bVar35 & 0xf0 | bVar40 | (byte)(p->flags).m_val >> 3 & 2;
  this->field_0x5c0 = bVar35 ^ 2;
  this->field_0x5c0 = (bVar35 ^ 2) & 3 | ((char)p->storage_mode & 3) << 4;
  this->m_waiting_tracker = '\0';
  this->m_active_time = 0;
  this->m_finished_time = 0;
  bVar35 = (byte)((uint)(p->flags).m_val >> 9) & 1;
  this->field_0x5cc = bVar3 & 0xf8 | bVar35;
  bVar32 = (byte)((uint)(p->flags).m_val >> 5) & 8;
  this->field_0x5cc = bVar3 & 0xf0 | bVar35 | bVar32;
  bVar33 = (byte)((uint)(p->flags).m_val >> 6) & 0x10;
  this->field_0x5cc = bVar3 & 0xe0 | bVar35 | bVar32 | bVar33;
  bVar35 = (bVar3 & 0xc0 | bVar35 | bVar32 | bVar33 | (byte)((uint)(p->flags).m_val >> 0xe) & 0x20)
           ^ 0x20;
  this->field_0x5cc = bVar35;
  bVar35 = (bVar35 & 0xb9 | (byte)((uint)(p->flags).m_val >> 0xe) & 0x40) ^ 0x40;
  this->field_0x5cc = bVar35;
  this->field_0x5cc = bVar35 & 0x79 | (byte)((uint)(p->flags).m_val >> 0x11) & 0x80;
  this->m_seeding_time = 0;
  *(undefined3 *)&this->field_0x5d4 = 0xffffff;
  this->m_need_save_resume_data = '\0';
  uVar29 = *(uint *)&this->field_0x5d8;
  *(uint *)&this->field_0x5d8 = uVar29 & 0xff000000;
  uVar29 = (uVar29 & 0xfe000000) + ((uint)(p->flags).m_val & 0x200000) * 8 ^ 0x1000000;
  *(uint *)&this->field_0x5d8 = uVar29;
  *(uint *)&this->field_0x5d8 = uVar29 & 0xf1000000 | ((uint)(p->flags).m_val & 8) << 0x16;
  iVar27 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
             [0x2e])();
  iVar27 = session_settings::get_int((session_settings *)CONCAT44(extraout_var_03,iVar27),0x4062);
  this->m_connect_boost_counter = (uint8_t)iVar27;
  uVar29 = *(uint *)&this->field_0x5dd;
  *(uint *)&this->field_0x5dd = uVar29 | 0xffffff;
  *(uint *)&this->field_0x5dd =
       (uVar29 & 0xf8ffffff | 0xffffff | ((uint)(p->flags).m_val & 0x10) << 0x14) ^ 0x1000000;
  tVar28 = from_time_t(p->last_download);
  (this->m_last_download).__d.__r = (rep_conflict)tVar28.__d.__r;
  this->m_num_seeds = 0;
  this->m_num_connecting_seeds = 0;
  tVar28 = from_time_t(p->last_upload);
  (this->m_last_upload).__d.__r = (rep_conflict)tVar28.__d.__r;
  pvVar17 = (p->userdata).m_client_ptr;
  (this->m_userdata).m_type_ptr = (p->userdata).m_type_ptr;
  (this->m_userdata).m_client_ptr = pvVar17;
  *(uint *)&this->field_0x600 =
       ((uint)(p->flags).m_val >> 5 & 1) + (*(uint *)&this->field_0x600 & 0x80000000) + 0x7fffff9e;
  *(undefined2 *)&this->field_0x604 = 0;
  this->field_0x606 = this->field_0x606 & 0x80;
  if (((p->flags).m_val & 0x2000) != 0) {
    (this->m_need_save_resume_data).m_val = (this->m_need_save_resume_data).m_val | 0x80;
  }
  if ((this->field_0x5db & 2) == 0) {
    inc_stats_counter(this,0xdb,1);
  }
  this_00 = &(this->super_torrent_hot_members).m_torrent_file;
  peVar37 = (this->super_torrent_hot_members).m_torrent_file.
            super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar37 == (element_type *)0x0) {
    if ((p->ti).super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      ::std::make_shared<libtorrent::torrent_info,libtorrent::info_hash_t&>((info_hash_t *)&e_1);
    }
    else {
      ::std::__shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2> *)&e_1,
                 &(p->ti).super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>);
    }
    ::std::__shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&this_00->super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2> *)&e_1);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &e_1.list_hook.super_type.super_type.prev_);
    peVar37 = (this_00->super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
  }
  if (((peVar37->m_flags).m_val & 4) != 0) {
    this->field_0x5cc = this->field_0x5cc | 0x80;
  }
  if (0 < (peVar37->m_files).m_piece_length) {
    ec = initialize_merkle_trees(this);
    if ((ec._0_8_ >> 0x20 & 1) != 0) {
      this_03 = (system_error *)__cxa_allocate_exception(0x40);
      boost::system::system_error::system_error(this_03,ec);
      __cxa_throw(this_03,&boost::system::system_error::typeinfo,
                  boost::system::system_error::~system_error);
    }
    peVar37 = (this->super_torrent_hot_members).m_torrent_file.
              super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->super_torrent_hot_members).m_size_on_disk = (peVar37->m_files).m_size_on_disk;
  }
  ws.super__Vector_base<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ws.super__Vector_base<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ws.super__Vector_base<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (((p->flags).m_val & 0x1000) == 0) {
    pwVar5 = (peVar37->m_web_seeds).
             super__Vector_base<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (__args = (peVar37->m_web_seeds).
                  super__Vector_base<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>
                  ._M_impl.super__Vector_impl_data._M_start; __args != pwVar5; __args = __args + 1)
    {
      ::std::vector<libtorrent::aux::web_seed_t,std::allocator<libtorrent::aux::web_seed_t>>::
      emplace_back<libtorrent::web_seed_entry_const&>
                ((vector<libtorrent::aux::web_seed_t,std::allocator<libtorrent::aux::web_seed_t>> *)
                 &ws,__args);
    }
    peVar37 = (this_00->super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
  }
  if ((peVar37->m_files).m_piece_length < 1) {
    bVar40 = false;
  }
  else {
    iVar27 = file_storage::num_files(&peVar37->m_files);
    bVar40 = 1 < iVar27;
  }
  pbVar6 = (p->url_seeds).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar38 = (p->url_seeds).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pbVar38 != pbVar6; pbVar38 = pbVar38 + 1
      ) {
    ::std::vector<libtorrent::aux::web_seed_t,std::allocator<libtorrent::aux::web_seed_t>>::
    emplace_back<std::__cxx11::string_const&>
              ((vector<libtorrent::aux::web_seed_t,std::allocator<libtorrent::aux::web_seed_t>> *)
               &ws,pbVar38);
    if (bVar40) {
      ensure_trailing_slash
                ((string *)
                 (ws.
                  super__Vector_base<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>
                  ._M_impl.super__Vector_impl_data._M_finish + -1));
    }
    ptVar7 = (this_00->super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    if ((ptVar7->m_files).m_piece_length < 1) {
      e_1.list_hook.super_type.super_type.next_ = (node_ptr)&e_1.url;
      e_1.list_hook.super_type.super_type.prev_ = (node_ptr)0x0;
      e_1.url._M_dataplus._M_p._0_1_ = 0;
      local_a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  )0x0;
      local_98._M_p = (pointer)0x0;
      torrent_info::add_url_seed
                (ptVar7,(string *)
                        (ws.
                         super__Vector_base<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>
                         ._M_impl.super__Vector_impl_data._M_finish + -1),(string *)&e_1,
                 (headers_t *)&local_a8);
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&local_a8);
      ::std::__cxx11::string::~string((string *)&e_1);
    }
  }
  random_shuffle<std::vector<libtorrent::aux::web_seed_t,std::allocator<libtorrent::aux::web_seed_t>>>
            (&ws);
  pwVar25 = ws.
            super__Vector_base<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (__args_00 = ws.
                   super__Vector_base<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>
                   ._M_impl.super__Vector_impl_data._M_start; __args_00 != pwVar25;
      __args_00 = __args_00 + 1) {
    ::std::__cxx11::list<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>
    ::emplace_back<libtorrent::aux::web_seed_t>(this_01,__args_00);
  }
  if (((p->flags).m_val & 0x800) == 0) {
    tracker_list::replace
              (this_02,&(((this_00->
                          super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr)->m_urls).
                        super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
              );
  }
  piVar36 = (p->tracker_tiers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  pbVar6 = (p->trackers).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  iVar27 = 0;
  for (pbVar38 = (p->trackers).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pbVar38 != pbVar6; pbVar38 = pbVar38 + 1
      ) {
    if (pbVar38->_M_string_length != 0) {
      u._M_str = (pbVar38->_M_dataplus)._M_p;
      u._M_len = pbVar38->_M_string_length;
      announce_entry::announce_entry(&e_1,u);
      if (piVar36 !=
          (p->tracker_tiers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        iVar27 = *piVar36;
        piVar36 = piVar36 + 1;
      }
      e_1.fail_limit = '\0';
      e_1._110_1_ = e_1._110_1_ & 0xf0 | 4;
      e_1.tier = (uint8_t)iVar27;
      bVar40 = tracker_list::add_tracker(this_02,&e_1);
      if ((bVar40) &&
         (ptVar7 = (this_00->
                   super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
         (ptVar7->m_files).m_piece_length < 1)) {
        torrent_info::add_tracker
                  (ptVar7,&e_1.url,(uint)e_1.tier,
                   (byte)e_1._110_1_ & (source_tex|source_magnet_link|source_client|source_torrent))
        ;
      }
      announce_entry::~announce_entry(&e_1);
    }
  }
  iVar27 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
             [0x2e])();
  bVar40 = session_settings::get_bool((session_settings *)CONCAT44(extraout_var_04,iVar27),0x8013);
  if (bVar40) {
    tracker_list::prioritize_udp_trackers(this_02);
  }
  if ((((this_00->super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
      ->m_files).m_piece_length < 1) {
    if ((p->name)._M_string_length != 0) {
      ::std::make_unique<std::__cxx11::string,std::__cxx11::string&>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e_1);
      plVar26 = e_1.list_hook.super_type.super_type.next_;
      e_1.list_hook.super_type.super_type.next_ = (node_ptr)0x0;
      ::std::
      __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reset((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&this->m_name,(pointer)plVar26);
      ::std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&e_1);
    }
    goto LAB_002ce186;
  }
  if (((p->flags).m_val & 1) == 0) {
LAB_002ce12a:
    bVar35 = 0;
  }
  else {
    _Var31 = ::std::
             __find_if<__gnu_cxx::__normal_iterator<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>*,std::vector<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,std::allocator<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>>>>,__gnu_cxx::__ops::_Iter_equals_val<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>const>>
                       ((p->file_priorities).
                        super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (p->file_priorities).
                        super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,&dont_download);
    if (_Var31._M_current !=
        (p->file_priorities).
        super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) goto LAB_002ce12a;
    _Var31 = ::std::
             __find_if<__gnu_cxx::__normal_iterator<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>*,std::vector<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,std::allocator<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>>>>,__gnu_cxx::__ops::_Iter_equals_val<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>const>>
                       ((p->piece_priorities).
                        super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (p->piece_priorities).
                        super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,&dont_download);
    if (_Var31._M_current !=
        (p->piece_priorities).
        super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) goto LAB_002ce12a;
    _Var39._M_head_impl =
         *(uint **)&(p->have_pieces).super_bitfield.m_buf.
                    super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
                    super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
                    super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>;
    if ((_Head_base<0UL,_unsigned_int_*,_false>)_Var39._M_head_impl !=
        (_Head_base<0UL,_unsigned_int_*,_false>)0x0) {
      _Var39._M_head_impl = _Var39._M_head_impl + 1;
    }
    cVar41 = bitfield::end(&(p->have_pieces).super_bitfield);
    e_1.list_hook.super_type.super_type.next_ =
         (node_ptr)((ulong)e_1.list_hook.super_type.super_type.next_ & 0xffffffffffffff00);
    cVar41 = ::std::
             __find_if<libtorrent::bitfield::const_iterator,__gnu_cxx::__ops::_Iter_equals_val<bool_const>>
                       (_Var39._M_head_impl,0x80000000,cVar41.buf,cVar41._8_8_ & 0xffffffff);
    cVar42 = bitfield::end(&(p->have_pieces).super_bitfield);
    bVar35 = (cVar41.bit == cVar42.bit && cVar41.buf == cVar42.buf) << 2;
  }
  this->field_0x5cc = this->field_0x5cc & 0xfb | bVar35;
  puVar1 = &(this->super_torrent_hot_members).field_0x4b;
  *puVar1 = *puVar1 | 2;
LAB_002ce186:
  ::std::
  vector<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,std::allocator<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>>>
  ::
  _M_assign_aux<__gnu_cxx::__normal_iterator<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>*,std::vector<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,std::allocator<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>>>>>
            ((vector<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,std::allocator<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>>>
              *)&this->m_file_priority,
             (p->file_priorities).
             super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (p->file_priorities).
             super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  if ((this->field_0x5cc & 4) != 0) {
    bitfield::resize(&(this->m_verified).super_bitfield,
                     (((this_00->
                       super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr)->m_files).m_num_pieces,false);
    bitfield::resize(&(this->m_verifying).super_bitfield,
                     (((this_00->
                       super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr)->m_files).m_num_pieces,false);
  }
  iVar24 = p->total_downloaded;
  this->m_total_uploaded = p->total_uploaded;
  this->m_total_downloaded = iVar24;
  (this->m_active_time).__r = p->active_time;
  (this->m_finished_time).__r = p->finished_time;
  (this->m_seeding_time).__r = p->seeding_time;
  if ((this->m_completed_time != 0) && (this->m_completed_time < this->m_added_time)) {
    this->m_completed_time = this->m_added_time;
  }
  peVar37 = (this_00->super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr;
  if (0 < (peVar37->m_files).m_piece_length) {
    bVar40 = info_hash_t::has_v2(&peVar37->m_info_hash);
    if (bVar40) {
      pfVar8 = (pointer)(p->merkle_trees).
                        super_vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
                        .
                        super__Vector_base<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
      pfVar9 = (pointer)(p->merkle_trees).
                        super_vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
                        .
                        super__Vector_base<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
      if (pfVar8 != pfVar9) {
        local_48.
        super__Vector_base<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (p->merkle_trees).
             super_vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
             .
             super__Vector_base<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (p->merkle_trees).
        super_vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
        .
        super__Vector_base<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pvVar22 = &(p->merkle_trees).
                   super_vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
        ;
        (pvVar22->
        super__Vector_base<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pvVar22->
        super__Vector_base<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_68.super__Vector_base<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (p->merkle_tree_mask).
             super_vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>.
             super__Vector_base<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>._M_impl
             .super__Vector_impl_data._M_start;
        local_68.super__Vector_base<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             (p->merkle_tree_mask).
             super_vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>.
             super__Vector_base<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>._M_impl
             .super__Vector_impl_data._M_finish;
        local_68.super__Vector_base<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             (p->merkle_tree_mask).
             super_vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>.
             super__Vector_base<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
        pvVar23 = &(p->merkle_tree_mask).
                   super_vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>;
        (pvVar23->super__Vector_base<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>).
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pvVar23->super__Vector_base<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>).
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (p->merkle_tree_mask).
        super_vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>.
        super__Vector_base<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_88._M_allocated_capacity =
             (size_type)
             (p->verified_leaf_hashes).
             super_vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>.
             super__Vector_base<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>._M_impl
             .super__Vector_impl_data._M_start;
        local_88._8_8_ =
             (p->verified_leaf_hashes).
             super_vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>.
             super__Vector_base<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>._M_impl
             .super__Vector_impl_data._M_finish;
        local_78 = (p->verified_leaf_hashes).
                   super_vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>.
                   super__Vector_base<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        pvVar23 = &(p->verified_leaf_hashes).
                   super_vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>;
        (pvVar23->super__Vector_base<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>).
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pvVar23->super__Vector_base<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>).
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (p->verified_leaf_hashes).
        super_vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>.
        super__Vector_base<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_48.
        super__Vector_base<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)pfVar8;
        local_48.
        super__Vector_base<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)pfVar9;
        load_merkle_trees(this,(vector<std::vector<sha256_hash>,_file_index_t> *)&local_48,
                          (vector<bitfield,_file_index_t> *)&local_68,
                          (vector<bitfield,_file_index_t> *)&local_88);
        ::std::vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>::~vector
                  ((vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_> *)&local_88)
        ;
        ::std::vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>::~vector
                  (&local_68);
        ::std::
        vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
        ::~vector(&local_48);
      }
    }
  }
  peVar37 = (this_00->super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr;
  if (0 < (peVar37->m_files).m_piece_length) {
    inc_stats_counter(this,0x6e,(peVar37->m_files).m_num_pieces);
  }
  ::std::make_unique<libtorrent::add_torrent_params,libtorrent::add_torrent_params>
            ((add_torrent_params *)&e_1);
  plVar26 = e_1.list_hook.super_type.super_type.next_;
  e_1.list_hook.super_type.super_type.next_ = (node_ptr)0x0;
  ::std::
  __uniq_ptr_impl<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
  ::reset((__uniq_ptr_impl<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
           *)&this->m_add_torrent_params,(pointer)plVar26);
  ::std::
  unique_ptr<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>::
  ~unique_ptr((unique_ptr<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
               *)&e_1);
  ::std::vector<libtorrent::aux::web_seed_t,_std::allocator<libtorrent::aux::web_seed_t>_>::~vector
            (&ws);
  return;
}

Assistant:

torrent::torrent(
		aux::session_interface& ses
		, bool const session_paused
		, add_torrent_params&& p)
		: torrent_hot_members(ses, p, session_paused)
		, m_total_uploaded(p.total_uploaded)
		, m_total_downloaded(p.total_downloaded)
		, m_tracker_timer(ses.get_context())
		, m_inactivity_timer(ses.get_context())
		, m_trackerid(p.trackerid)
		, m_save_path(complete(p.save_path))
		, m_stats_counters(ses.stats_counters())
		, m_added_time(p.added_time ? p.added_time : std::time(nullptr))
		, m_completed_time(p.completed_time)
		, m_last_seen_complete(p.last_seen_complete)
		, m_swarm_last_seen_complete(p.last_seen_complete)
		, m_info_hash(p.info_hashes)
		, m_error_file(torrent_status::error_file_none)
		, m_sequence_number(-1)
		, m_peer_id(aux::generate_peer_id(settings()))
		, m_announce_to_trackers(!(p.flags & torrent_flags::paused))
		, m_announce_to_lsd(!(p.flags & torrent_flags::paused))
		, m_has_incoming(false)
		, m_files_checked(false)
		, m_storage_mode(p.storage_mode)
		, m_announcing(false)
		, m_added(false)
		, m_sequential_download(p.flags & torrent_flags::sequential_download)
		, m_auto_sequential(false)
		, m_seed_mode(false)
#ifndef TORRENT_DISABLE_SUPERSEEDING
		, m_super_seeding(p.flags & torrent_flags::super_seeding)
#endif
		, m_stop_when_ready(p.flags & torrent_flags::stop_when_ready)
		, m_enable_dht(!bool(p.flags & torrent_flags::disable_dht))
		, m_enable_lsd(!bool(p.flags & torrent_flags::disable_lsd))
		, m_i2p(bool(p.flags & torrent_flags::i2p_torrent))
		, m_max_uploads((1 << 24) - 1)
		, m_num_uploads(0)
		, m_enable_pex(!bool(p.flags & torrent_flags::disable_pex))
		, m_apply_ip_filter(p.flags & torrent_flags::apply_ip_filter)
		, m_pending_active_change(false)
		, m_v2_piece_layers_validated(false)
		, m_connect_boost_counter(static_cast<std::uint8_t>(settings().get_int(settings_pack::torrent_connect_boost)))
		, m_incomplete(0xffffff)
		, m_announce_to_dht(!(p.flags & torrent_flags::paused))
		, m_ssl_torrent(false)
		, m_deleted(false)
		, m_last_download(aux::from_time_t(p.last_download))
		, m_last_upload(aux::from_time_t(p.last_upload))
		, m_userdata(p.userdata)
		, m_auto_managed(p.flags & torrent_flags::auto_managed)
		, m_current_gauge_state(static_cast<std::uint32_t>(no_gauge_state))
		, m_moving_storage(false)
		, m_inactive(false)
		, m_downloaded(0xffffff)
		, m_progress_ppm(0)
		, m_torrent_initialized(false)
		, m_outstanding_file_priority(false)
		, m_complete_sent(false)
	{
		if (p.flags & torrent_flags::need_save_resume)
		{
			m_need_save_resume_data |= torrent_handle::if_metadata_changed;
		}

		// we cannot log in the constructor, because it relies on shared_from_this
		// being initialized, which happens after the constructor returns.

#if TORRENT_USE_UNC_PATHS
		m_save_path = canonicalize_path(m_save_path);
#endif

		if (!m_apply_ip_filter)
		{
			inc_stats_counter(counters::non_filter_torrents);
		}

		if (!m_torrent_file)
			m_torrent_file = (p.ti ? p.ti : std::make_shared<torrent_info>(m_info_hash));

#if TORRENT_USE_I2P
		if (m_torrent_file->is_i2p())
			m_i2p = true;
#endif

		if (m_torrent_file->is_valid())
		{
			error_code ec = initialize_merkle_trees();
			if (ec) throw system_error(ec);
			m_size_on_disk = m_torrent_file->files().size_on_disk();
		}

		// --- WEB SEEDS ---

		// if override web seed flag is set, don't load any web seeds from the
		// torrent file.
		std::vector<web_seed_t> ws;
		if (!(p.flags & torrent_flags::deprecated_override_web_seeds))
		{
			for (auto const& e : m_torrent_file->internal_web_seeds())
				ws.emplace_back(e);
		}

		// add web seeds from add_torrent_params
		bool const multi_file = m_torrent_file->is_valid()
				&& m_torrent_file->num_files() > 1;

		for (auto const& u : p.url_seeds)
		{
			ws.emplace_back(u);

			// correct URLs to end with a "/" for multi-file torrents
			if (multi_file)
				ensure_trailing_slash(ws.back().url);
#if TORRENT_ABI_VERSION < 4
			if (!m_torrent_file->is_valid())
				m_torrent_file->add_url_seed(ws.back().url);
#endif
		}

		aux::random_shuffle(ws);
		for (auto& w : ws) m_web_seeds.emplace_back(std::move(w));

		// --- TRACKERS ---

		// if override trackers flag is set, don't load trackers from torrent file
		if (!(p.flags & torrent_flags::deprecated_override_trackers))
		{
			m_trackers.replace(m_torrent_file->internal_trackers());
		}

		int tier = 0;
		auto tier_iter = p.tracker_tiers.begin();
		for (auto const& url : p.trackers)
		{
			if (url.empty()) continue;

			aux::announce_entry e(url);
			if (tier_iter != p.tracker_tiers.end())
				tier = *tier_iter++;

			e.fail_limit = 0;
			e.source = lt::announce_entry::source_magnet_link;
			e.tier = std::uint8_t(tier);

			if (!m_trackers.add_tracker(e))
				continue;

#if TORRENT_ABI_VERSION < 4
			// add the tracker to the m_torrent_file here so that the trackers
			// will be preserved via create_torrent() when passing in just the
			// torrent_info object.
			if (!m_torrent_file->is_valid())
				m_torrent_file->add_tracker(e.url, e.tier, lt::announce_entry::tracker_source(e.source));
#endif
		}

		if (settings().get_bool(settings_pack::prefer_udp_trackers))
			m_trackers.prioritize_udp_trackers();

		if (m_torrent_file->is_valid())
		{
			// setting file- or piece priorities for seed mode makes no sense. If a
			// torrent ends up in seed mode by accident, it can be very confusing,
			// so assume the seed mode flag is not intended and don't enable it in
			// that case. Also, if the resume data says we're missing a piece, we
			// can't be in seed-mode.
			m_seed_mode = (p.flags & torrent_flags::seed_mode)
				&& std::find(p.file_priorities.begin(), p.file_priorities.end(), dont_download) == p.file_priorities.end()
				&& std::find(p.piece_priorities.begin(), p.piece_priorities.end(), dont_download) == p.piece_priorities.end()
				&& std::find(p.have_pieces.begin(), p.have_pieces.end(), false) == p.have_pieces.end();

			m_connections_initialized = true;
		}
		else
		{
			if (!p.name.empty()) m_name = std::make_unique<std::string>(p.name);
		}

		TORRENT_ASSERT(is_single_thread());
		m_file_priority.assign(p.file_priorities.begin(), p.file_priorities.end());

		if (m_seed_mode)
		{
			m_verified.resize(m_torrent_file->num_pieces(), false);
			m_verifying.resize(m_torrent_file->num_pieces(), false);
		}

		m_total_uploaded = p.total_uploaded;
		m_total_downloaded = p.total_downloaded;

		// the number of seconds this torrent has spent in started, finished and
		// seeding state so far, respectively.
		m_active_time = seconds(p.active_time);
		m_finished_time = seconds(p.finished_time);
		m_seeding_time = seconds(p.seeding_time);

		if (m_completed_time != 0 && m_completed_time < m_added_time)
			m_completed_time = m_added_time;

		// --- V2 HASHES ---

		if (m_torrent_file->is_valid() && m_torrent_file->info_hashes().has_v2())
		{
			if (!p.merkle_trees.empty())
				load_merkle_trees(
					std::move(p.merkle_trees)
					, std::move(p.merkle_tree_mask)
					, std::move(p.verified_leaf_hashes));

			// we really don't want to store extra copies of the trees
			TORRENT_ASSERT(p.merkle_trees.empty());
		}

		if (valid_metadata())
		{
			inc_stats_counter(counters::num_total_pieces_added
				, m_torrent_file->num_pieces());
		}

		// TODO: 3 we could probably get away with just saving a few fields here
		m_add_torrent_params = std::make_unique<add_torrent_params>(std::move(p));
	}